

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

PtrTokenOrSyntax * __thiscall
slang::syntax::SignalEventExpressionSyntax::getChildPtr
          (SignalEventExpressionSyntax *this,size_t index)

{
  long in_RSI;
  PtrTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffc8;
  PtrTokenOrSyntax *local_10;
  
  if (in_RSI == 0) {
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,(Token *)in_stack_ffffffffffffffc8);
  }
  else if (in_RSI == 1) {
    not_null<slang::syntax::ExpressionSyntax_*>::get
              ((not_null<slang::syntax::ExpressionSyntax_*> *)
               ((long)&in_RDI[2].super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                       .super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                       super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                       .
                       super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                       .super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                       .super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                       .
                       super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
               + 8));
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
  }
  else if (in_RSI == 2) {
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
  }
  else {
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
  }
  return local_10;
}

Assistant:

PtrTokenOrSyntax SignalEventExpressionSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &edge;
        case 1: return expr.get();
        case 2: return iffClause;
        default: return nullptr;
    }
}